

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::AddISPCTargetFlags(cmGeneratorTarget *this,string *flags)

{
  cmMakefile *this_00;
  string_view sep;
  bool bVar1;
  string *psVar2;
  string *__lhs;
  string_view value;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  cmAlphaNum local_c8;
  undefined8 local_98;
  char *pcStack_90;
  string local_88;
  string local_68;
  cmAlphaNum local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"ISPC_INSTRUCTION_SETS",(allocator<char> *)&local_48);
  psVar2 = GetSafeProperty(this,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  value._M_str = (psVar2->_M_dataplus)._M_p;
  value._M_len = psVar2->_M_string_length;
  bVar1 = cmValue::IsOff(value);
  if (!bVar1) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CMAKE_ISPC_COMPILER_ID",(allocator<char> *)&local_48);
    __lhs = cmMakefile::GetSafeDefinition(this_00,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    bVar1 = std::operator==(__lhs,"Intel");
    if (bVar1) {
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arg._M_str = (psVar2->_M_dataplus)._M_p;
      arg._M_len = psVar2->_M_string_length;
      cmExpandList(arg,&local_e8,false);
      if (local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_c8.View_._M_len = 10;
        local_c8.View_._M_str = " --target=";
        local_98 = 1;
        pcStack_90 = ",";
        sep._M_str = ",";
        sep._M_len = 1;
        cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_88,(string_view)(ZEXT816(0x5f8929) << 0x40),&local_e8,
                   (string_view)(ZEXT816(0x5f8929) << 0x40),sep);
        local_48.View_._M_len = local_88._M_string_length;
        local_48.View_._M_str = local_88._M_dataplus._M_p;
        cmStrCat<>(&local_68,&local_c8,&local_48);
        std::__cxx11::string::append((string *)flags);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddISPCTargetFlags(std::string& flags) const
{
  const std::string& property = this->GetSafeProperty("ISPC_INSTRUCTION_SETS");

  // If ISPC_TARGET is false we don't add any architectures.
  if (cmIsOff(property)) {
    return;
  }

  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_ISPC_COMPILER_ID");

  if (compiler == "Intel") {
    std::vector<std::string> targets;
    cmExpandList(property, targets);
    if (!targets.empty()) {
      flags += cmStrCat(" --target=", cmWrap("", targets, "", ","));
    }
  }
}